

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

void png_format_buffer(png_const_structrp png_ptr,png_charp buffer,png_const_charp error_message)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  png_charp pcVar5;
  uint uVar6;
  
  uVar1 = png_ptr->chunk_name;
  iVar2 = 0;
  for (iVar3 = 0x18; -1 < iVar3; iVar3 = iVar3 + -8) {
    uVar6 = uVar1 >> ((byte)iVar3 & 0x1f);
    if ((uVar6 & 0xff) - 0x5b < 6 || (uVar6 & 0xff) - 0x7b < 0xffffffc6) {
      buffer[iVar2] = '[';
      buffer[(long)iVar2 + 1] = "0123456789ABCDEF"[uVar6 >> 4 & 0xf];
      buffer[(long)iVar2 + 2] = "0123456789ABCDEF"[uVar6 & 0xf];
      buffer[(long)iVar2 + 3] = ']';
      iVar2 = iVar2 + 4;
    }
    else {
      buffer[iVar2] = (char)uVar6;
      iVar2 = iVar2 + 1;
    }
  }
  pcVar5 = buffer + iVar2;
  if (error_message != (png_const_charp)0x0) {
    pcVar5[0] = ':';
    pcVar5[1] = ' ';
    iVar3 = iVar2 + 0xc5;
    for (lVar4 = 0; lVar4 != 0xc3; lVar4 = lVar4 + 1) {
      if (error_message[lVar4] == '\0') {
        iVar3 = iVar2 + 2 + (int)lVar4;
        break;
      }
      buffer[lVar4 + (iVar2 + 2)] = error_message[lVar4];
    }
    pcVar5 = buffer + iVar3;
  }
  *pcVar5 = '\0';
  return;
}

Assistant:

static void /* PRIVATE */
png_format_buffer(png_const_structrp png_ptr, png_charp buffer, png_const_charp
    error_message)
{
   png_uint_32 chunk_name = png_ptr->chunk_name;
   int iout = 0, ishift = 24;

   while (ishift >= 0)
   {
      int c = (int)(chunk_name >> ishift) & 0xff;

      ishift -= 8;
      if (isnonalpha(c) != 0)
      {
         buffer[iout++] = PNG_LITERAL_LEFT_SQUARE_BRACKET;
         buffer[iout++] = png_digit[(c & 0xf0) >> 4];
         buffer[iout++] = png_digit[c & 0x0f];
         buffer[iout++] = PNG_LITERAL_RIGHT_SQUARE_BRACKET;
      }

      else
      {
         buffer[iout++] = (char)c;
      }
   }

   if (error_message == NULL)
      buffer[iout] = '\0';

   else
   {
      int iin = 0;

      buffer[iout++] = ':';
      buffer[iout++] = ' ';

      while (iin < PNG_MAX_ERROR_TEXT-1 && error_message[iin] != '\0')
         buffer[iout++] = error_message[iin++];

      /* iin < PNG_MAX_ERROR_TEXT, so the following is safe: */
      buffer[iout] = '\0';
   }
}